

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_sse4.c
# Opt level: O3

void av1_build_compound_diffwtd_mask_sse4_1
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int stride0,uint8_t *src1,
               int stride1,int h,int w)

{
  uint8_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  int iVar26;
  undefined7 in_register_00000031;
  long lVar27;
  int iVar28;
  int j;
  short sVar29;
  short sVar31;
  undefined1 auVar30 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ushort uVar35;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM5 [16];
  
  auVar30 = ZEXT416((uint)((int)CONCAT71(in_register_00000031,mask_type) != 1) * 0x40 - 0x1a);
  auVar30 = pshuflw(auVar30,auVar30,0);
  sVar29 = auVar30._0_2_;
  sVar31 = auVar30._2_2_;
  if (w == 4) {
    lVar27 = 0;
    do {
      auVar30._4_4_ = *(undefined4 *)(src0 + stride0);
      auVar30._0_4_ = *(undefined4 *)src0;
      auVar30._8_8_ = 0;
      auVar30 = pmovzxbw(auVar30,auVar30);
      auVar45._4_4_ = *(undefined4 *)(src1 + stride1);
      auVar45._0_4_ = *(undefined4 *)src1;
      auVar45._8_8_ = 0;
      auVar37 = pmovzxbw(auVar45,auVar45);
      uVar18 = auVar37._0_2_;
      uVar35 = auVar30._0_2_;
      uVar19 = auVar37._2_2_;
      uVar38 = auVar30._2_2_;
      uVar20 = auVar37._4_2_;
      uVar39 = auVar30._4_2_;
      uVar21 = auVar37._6_2_;
      uVar40 = auVar30._6_2_;
      uVar22 = auVar37._8_2_;
      uVar41 = auVar30._8_2_;
      uVar23 = auVar37._10_2_;
      uVar42 = auVar30._10_2_;
      uVar24 = auVar37._12_2_;
      uVar43 = auVar30._12_2_;
      uVar44 = auVar30._14_2_;
      uVar25 = auVar37._14_2_;
      auVar37._0_2_ =
           ((ushort)(((uVar35 < uVar18) * uVar18 | (uVar35 >= uVar18) * uVar35) -
                    ((uVar18 < uVar35) * uVar18 | (uVar18 >= uVar35) * uVar35)) >> 4) + sVar29;
      auVar37._2_2_ =
           ((ushort)(((uVar38 < uVar19) * uVar19 | (uVar38 >= uVar19) * uVar38) -
                    ((uVar19 < uVar38) * uVar19 | (uVar19 >= uVar38) * uVar38)) >> 4) + sVar31;
      auVar37._4_2_ =
           ((ushort)(((uVar39 < uVar20) * uVar20 | (uVar39 >= uVar20) * uVar39) -
                    ((uVar20 < uVar39) * uVar20 | (uVar20 >= uVar39) * uVar39)) >> 4) + sVar29;
      auVar37._6_2_ =
           ((ushort)(((uVar40 < uVar21) * uVar21 | (uVar40 >= uVar21) * uVar40) -
                    ((uVar21 < uVar40) * uVar21 | (uVar21 >= uVar40) * uVar40)) >> 4) + sVar31;
      auVar37._8_2_ =
           ((ushort)(((uVar41 < uVar22) * uVar22 | (uVar41 >= uVar22) * uVar41) -
                    ((uVar22 < uVar41) * uVar22 | (uVar22 >= uVar41) * uVar41)) >> 4) + sVar29;
      auVar37._10_2_ =
           ((ushort)(((uVar42 < uVar23) * uVar23 | (uVar42 >= uVar23) * uVar42) -
                    ((uVar23 < uVar42) * uVar23 | (uVar23 >= uVar42) * uVar42)) >> 4) + sVar31;
      auVar37._12_2_ =
           ((ushort)(((uVar43 < uVar24) * uVar24 | (uVar43 >= uVar24) * uVar43) -
                    ((uVar24 < uVar43) * uVar24 | (uVar24 >= uVar43) * uVar43)) >> 4) + sVar29;
      auVar37._14_2_ =
           ((ushort)(((uVar44 < uVar25) * uVar25 | (uVar44 >= uVar25) * uVar44) -
                    ((uVar25 < uVar44) * uVar25 | (uVar25 >= uVar44) * uVar44)) >> 4) + sVar31;
      auVar30 = pabsw(auVar37,auVar37);
      sVar2 = auVar30._0_2_;
      sVar3 = auVar30._2_2_;
      sVar4 = auVar30._4_2_;
      sVar5 = auVar30._6_2_;
      sVar6 = auVar30._8_2_;
      sVar7 = auVar30._10_2_;
      sVar8 = auVar30._12_2_;
      sVar9 = auVar30._14_2_;
      *(ulong *)(mask + lVar27 * 4) =
           CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar30[0xe] - (0xff < sVar9),
                    CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar30[0xc] - (0xff < sVar8),
                             CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar30[10] - (0xff < sVar7),
                                      CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar30[8] -
                                               (0xff < sVar6),
                                               CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar30[6] -
                                                        (0xff < sVar5),
                                                        CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                                 auVar30[4] - (0xff < sVar4),
                                                                 CONCAT11((0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar30[2] -
                                                                          (0xff < sVar3),
                                                                          (0 < sVar2) *
                                                                          (sVar2 < 0x100) *
                                                                          auVar30[0] -
                                                                          (0xff < sVar2))))))));
      src0 = src0 + stride0 * 2;
      src1 = src1 + stride1 * 2;
      lVar27 = lVar27 + 2;
    } while ((int)lVar27 < h);
  }
  else if (w == 8) {
    iVar26 = 1;
    if (1 < h) {
      iVar26 = h;
    }
    lVar27 = 0;
    do {
      auVar30 = pmovzxbw(in_XMM1,*(undefined8 *)src0);
      in_XMM2 = pmovzxbw(in_XMM2,*(undefined8 *)src1);
      uVar18 = in_XMM2._0_2_;
      uVar35 = auVar30._0_2_;
      uVar19 = in_XMM2._2_2_;
      uVar38 = auVar30._2_2_;
      uVar20 = in_XMM2._4_2_;
      uVar39 = auVar30._4_2_;
      uVar21 = in_XMM2._6_2_;
      uVar40 = auVar30._6_2_;
      uVar22 = in_XMM2._8_2_;
      uVar41 = auVar30._8_2_;
      uVar23 = in_XMM2._10_2_;
      uVar42 = auVar30._10_2_;
      uVar24 = in_XMM2._12_2_;
      uVar43 = auVar30._12_2_;
      uVar44 = auVar30._14_2_;
      uVar25 = in_XMM2._14_2_;
      auVar32._0_2_ =
           ((ushort)(((uVar35 < uVar18) * uVar18 | (uVar35 >= uVar18) * uVar35) -
                    ((uVar18 < uVar35) * uVar18 | (uVar18 >= uVar35) * uVar35)) >> 4) + sVar29;
      auVar32._2_2_ =
           ((ushort)(((uVar38 < uVar19) * uVar19 | (uVar38 >= uVar19) * uVar38) -
                    ((uVar19 < uVar38) * uVar19 | (uVar19 >= uVar38) * uVar38)) >> 4) + sVar31;
      auVar32._4_2_ =
           ((ushort)(((uVar39 < uVar20) * uVar20 | (uVar39 >= uVar20) * uVar39) -
                    ((uVar20 < uVar39) * uVar20 | (uVar20 >= uVar39) * uVar39)) >> 4) + sVar29;
      auVar32._6_2_ =
           ((ushort)(((uVar40 < uVar21) * uVar21 | (uVar40 >= uVar21) * uVar40) -
                    ((uVar21 < uVar40) * uVar21 | (uVar21 >= uVar40) * uVar40)) >> 4) + sVar31;
      auVar32._8_2_ =
           ((ushort)(((uVar41 < uVar22) * uVar22 | (uVar41 >= uVar22) * uVar41) -
                    ((uVar22 < uVar41) * uVar22 | (uVar22 >= uVar41) * uVar41)) >> 4) + sVar29;
      auVar32._10_2_ =
           ((ushort)(((uVar42 < uVar23) * uVar23 | (uVar42 >= uVar23) * uVar42) -
                    ((uVar23 < uVar42) * uVar23 | (uVar23 >= uVar42) * uVar42)) >> 4) + sVar31;
      auVar32._12_2_ =
           ((ushort)(((uVar43 < uVar24) * uVar24 | (uVar43 >= uVar24) * uVar43) -
                    ((uVar24 < uVar43) * uVar24 | (uVar24 >= uVar43) * uVar43)) >> 4) + sVar29;
      auVar32._14_2_ =
           ((ushort)(((uVar44 < uVar25) * uVar25 | (uVar44 >= uVar25) * uVar44) -
                    ((uVar25 < uVar44) * uVar25 | (uVar25 >= uVar44) * uVar44)) >> 4) + sVar31;
      auVar30 = pabsw(auVar32,auVar32);
      sVar2 = auVar30._0_2_;
      sVar3 = auVar30._2_2_;
      sVar4 = auVar30._4_2_;
      sVar5 = auVar30._6_2_;
      sVar6 = auVar30._8_2_;
      sVar7 = auVar30._10_2_;
      sVar8 = auVar30._12_2_;
      sVar9 = auVar30._14_2_;
      in_XMM1._0_8_ =
           CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar30[0xe] - (0xff < sVar9),
                    CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar30[0xc] - (0xff < sVar8),
                             CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar30[10] - (0xff < sVar7),
                                      CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar30[8] -
                                               (0xff < sVar6),
                                               CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar30[6] -
                                                        (0xff < sVar5),
                                                        CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                                 auVar30[4] - (0xff < sVar4),
                                                                 CONCAT11((0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar30[2] -
                                                                          (0xff < sVar3),
                                                                          (0 < sVar2) *
                                                                          (sVar2 < 0x100) *
                                                                          auVar30[0] -
                                                                          (0xff < sVar2))))))));
      in_XMM1[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar30[0] - (0xff < sVar2);
      in_XMM1[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar30[2] - (0xff < sVar3);
      in_XMM1[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar30[4] - (0xff < sVar4);
      in_XMM1[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar30[6] - (0xff < sVar5);
      in_XMM1[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar30[8] - (0xff < sVar6);
      in_XMM1[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar30[10] - (0xff < sVar7);
      in_XMM1[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar30[0xc] - (0xff < sVar8);
      in_XMM1[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar30[0xe] - (0xff < sVar9);
      *(undefined8 *)(mask + lVar27 * 8) = in_XMM1._0_8_;
      src0 = src0 + stride0;
      src1 = src1 + stride1;
      lVar27 = lVar27 + 1;
    } while (iVar26 != (int)lVar27);
  }
  else {
    iVar26 = 1;
    if (1 < h) {
      iVar26 = h;
    }
    iVar28 = 0;
    do {
      lVar27 = 0;
      do {
        auVar30 = *(undefined1 (*) [16])(src0 + lVar27);
        auVar37 = *(undefined1 (*) [16])(src1 + lVar27);
        auVar45 = pmovzxbw(in_XMM4,auVar30);
        in_XMM5 = pmovzxbw(in_XMM5,auVar37);
        auVar33._0_2_ = (ushort)auVar30[8] - (ushort)auVar37[8];
        auVar33._2_2_ = (ushort)auVar30[9] - (ushort)auVar37[9];
        auVar33._4_2_ = (ushort)auVar30[10] - (ushort)auVar37[10];
        auVar33._6_2_ = (ushort)auVar30[0xb] - (ushort)auVar37[0xb];
        auVar33._8_2_ = (ushort)auVar30[0xc] - (ushort)auVar37[0xc];
        auVar33._10_2_ = (ushort)auVar30[0xd] - (ushort)auVar37[0xd];
        auVar33._12_2_ = (ushort)auVar30[0xe] - (ushort)auVar37[0xe];
        auVar33._14_2_ = (ushort)auVar30[0xf] - (ushort)auVar37[0xf];
        uVar18 = in_XMM5._0_2_;
        uVar35 = auVar45._0_2_;
        auVar36._0_2_ = (uVar18 < uVar35) * uVar18 | (uVar18 >= uVar35) * uVar35;
        uVar19 = in_XMM5._2_2_;
        uVar38 = auVar45._2_2_;
        auVar36._2_2_ = (uVar19 < uVar38) * uVar19 | (uVar19 >= uVar38) * uVar38;
        uVar20 = in_XMM5._4_2_;
        uVar39 = auVar45._4_2_;
        auVar36._4_2_ = (uVar20 < uVar39) * uVar20 | (uVar20 >= uVar39) * uVar39;
        uVar21 = in_XMM5._6_2_;
        uVar40 = auVar45._6_2_;
        auVar36._6_2_ = (uVar21 < uVar40) * uVar21 | (uVar21 >= uVar40) * uVar40;
        uVar22 = in_XMM5._8_2_;
        uVar41 = auVar45._8_2_;
        auVar36._8_2_ = (uVar22 < uVar41) * uVar22 | (uVar22 >= uVar41) * uVar41;
        uVar23 = in_XMM5._10_2_;
        uVar42 = auVar45._10_2_;
        auVar36._10_2_ = (uVar23 < uVar42) * uVar23 | (uVar23 >= uVar42) * uVar42;
        uVar24 = in_XMM5._12_2_;
        uVar43 = auVar45._12_2_;
        uVar44 = auVar45._14_2_;
        auVar36._12_2_ = (uVar24 < uVar43) * uVar24 | (uVar24 >= uVar43) * uVar43;
        uVar25 = in_XMM5._14_2_;
        auVar36._14_2_ = (uVar25 < uVar44) * uVar25 | (uVar25 >= uVar44) * uVar44;
        in_XMM4._0_2_ =
             ((ushort)(((uVar35 < uVar18) * uVar18 | (uVar35 >= uVar18) * uVar35) - auVar36._0_2_)
             >> 4) + sVar29;
        in_XMM4._2_2_ =
             ((ushort)(((uVar38 < uVar19) * uVar19 | (uVar38 >= uVar19) * uVar38) - auVar36._2_2_)
             >> 4) + sVar31;
        in_XMM4._4_2_ =
             ((ushort)(((uVar39 < uVar20) * uVar20 | (uVar39 >= uVar20) * uVar39) - auVar36._4_2_)
             >> 4) + sVar29;
        in_XMM4._6_2_ =
             ((ushort)(((uVar40 < uVar21) * uVar21 | (uVar40 >= uVar21) * uVar40) - auVar36._6_2_)
             >> 4) + sVar31;
        in_XMM4._8_2_ =
             ((ushort)(((uVar41 < uVar22) * uVar22 | (uVar41 >= uVar22) * uVar41) - auVar36._8_2_)
             >> 4) + sVar29;
        in_XMM4._10_2_ =
             ((ushort)(((uVar42 < uVar23) * uVar23 | (uVar42 >= uVar23) * uVar42) - auVar36._10_2_)
             >> 4) + sVar31;
        in_XMM4._12_2_ =
             ((ushort)(((uVar43 < uVar24) * uVar24 | (uVar43 >= uVar24) * uVar43) - auVar36._12_2_)
             >> 4) + sVar29;
        in_XMM4._14_2_ =
             ((ushort)(((uVar44 < uVar25) * uVar25 | (uVar44 >= uVar25) * uVar44) - auVar36._14_2_)
             >> 4) + sVar31;
        auVar37 = pabsw(auVar36,in_XMM4);
        auVar30 = pabsw(auVar33,auVar33);
        auVar34._0_2_ = (auVar30._0_2_ >> 4) + sVar29;
        auVar34._2_2_ = (auVar30._2_2_ >> 4) + sVar31;
        auVar34._4_2_ = (auVar30._4_2_ >> 4) + sVar29;
        auVar34._6_2_ = (auVar30._6_2_ >> 4) + sVar31;
        auVar34._8_2_ = (auVar30._8_2_ >> 4) + sVar29;
        auVar34._10_2_ = (auVar30._10_2_ >> 4) + sVar31;
        auVar34._12_2_ = (auVar30._12_2_ >> 4) + sVar29;
        auVar34._14_2_ = (auVar30._14_2_ >> 4) + sVar31;
        auVar30 = pabsw(auVar34,auVar34);
        sVar2 = auVar37._0_2_;
        sVar3 = auVar37._2_2_;
        sVar4 = auVar37._4_2_;
        sVar5 = auVar37._6_2_;
        sVar6 = auVar37._8_2_;
        sVar7 = auVar37._10_2_;
        sVar8 = auVar37._12_2_;
        sVar9 = auVar37._14_2_;
        sVar10 = auVar30._0_2_;
        sVar11 = auVar30._2_2_;
        sVar12 = auVar30._4_2_;
        sVar13 = auVar30._6_2_;
        sVar14 = auVar30._8_2_;
        sVar15 = auVar30._10_2_;
        sVar16 = auVar30._12_2_;
        sVar17 = auVar30._14_2_;
        puVar1 = mask + lVar27;
        *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar37[0] - (0xff < sVar2);
        puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar37[2] - (0xff < sVar3);
        puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar37[4] - (0xff < sVar4);
        puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar37[6] - (0xff < sVar5);
        puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar37[8] - (0xff < sVar6);
        puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar37[10] - (0xff < sVar7);
        puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar37[0xc] - (0xff < sVar8);
        puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar37[0xe] - (0xff < sVar9);
        puVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar30[0] - (0xff < sVar10);
        puVar1[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar30[2] - (0xff < sVar11);
        puVar1[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar30[4] - (0xff < sVar12);
        puVar1[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar30[6] - (0xff < sVar13);
        puVar1[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar30[8] - (0xff < sVar14);
        puVar1[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar30[10] - (0xff < sVar15);
        puVar1[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar30[0xc] - (0xff < sVar16);
        puVar1[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar30[0xe] - (0xff < sVar17);
        lVar27 = lVar27 + 0x10;
      } while (lVar27 < w);
      src0 = src0 + stride0;
      src1 = src1 + stride1;
      mask = mask + w;
      iVar28 = iVar28 + 1;
    } while (iVar28 != iVar26);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_sse4_1(uint8_t *mask,
                                            DIFFWTD_MASK_TYPE mask_type,
                                            const uint8_t *src0, int stride0,
                                            const uint8_t *src1, int stride1,
                                            int h, int w) {
  const int mb = (mask_type == DIFFWTD_38_INV) ? AOM_BLEND_A64_MAX_ALPHA : 0;
  const __m128i mask_base = _mm_set1_epi16(38 - mb);
  int i = 0;
  if (4 == w) {
    do {
      const __m128i s0A = _mm_cvtsi32_si128(*(int *)src0);
      const __m128i s0B = _mm_cvtsi32_si128(*(int *)(src0 + stride0));
      const __m128i s0AB = _mm_unpacklo_epi32(s0A, s0B);
      const __m128i s0 = _mm_cvtepu8_epi16(s0AB);

      const __m128i s1A = _mm_cvtsi32_si128(*(int *)src1);
      const __m128i s1B = _mm_cvtsi32_si128(*(int *)(src1 + stride1));
      const __m128i s1AB = _mm_unpacklo_epi32(s1A, s1B);
      const __m128i s1 = _mm_cvtepu8_epi16(s1AB);

      const __m128i m16 = calc_mask(mask_base, s0, s1);
      const __m128i m8 = _mm_packus_epi16(m16, m16);

      *(int *)mask = _mm_cvtsi128_si32(m8);
      *(int *)(mask + w) = _mm_extract_epi32(m8, 1);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += 8;
      i += 2;
    } while (i < h);
  } else if (8 == w) {
    do {
      __m128i s0 = _mm_loadl_epi64((__m128i const *)src0);
      __m128i s1 = _mm_loadl_epi64((__m128i const *)src1);
      s0 = _mm_cvtepu8_epi16(s0);
      s1 = _mm_cvtepu8_epi16(s1);
      const __m128i m16 = calc_mask(mask_base, s0, s1);
      const __m128i m8 = _mm_packus_epi16(m16, m16);
      _mm_storel_epi64((__m128i *)mask, m8);
      src0 += stride0;
      src1 += stride1;
      mask += 8;
      i += 1;
    } while (i < h);
  } else {
    const __m128i zero = _mm_setzero_si128();
    do {
      int j = 0;
      do {
        const __m128i s0 = _mm_load_si128((__m128i const *)(src0 + j));
        const __m128i s1 = _mm_load_si128((__m128i const *)(src1 + j));
        const __m128i s0L = _mm_cvtepu8_epi16(s0);
        const __m128i s1L = _mm_cvtepu8_epi16(s1);
        const __m128i s0H = _mm_unpackhi_epi8(s0, zero);
        const __m128i s1H = _mm_unpackhi_epi8(s1, zero);

        const __m128i m16L = calc_mask(mask_base, s0L, s1L);
        const __m128i m16H = calc_mask(mask_base, s0H, s1H);

        const __m128i m8 = _mm_packus_epi16(m16L, m16H);
        _mm_store_si128((__m128i *)(mask + j), m8);
        j += 16;
      } while (j < w);
      src0 += stride0;
      src1 += stride1;
      mask += w;
      i += 1;
    } while (i < h);
  }
}